

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Node<int,_QHashDummyValue> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QHashDummyValue>_>::findNode<int>
          (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *this,int *key)

{
  byte bVar1;
  ulong uVar2;
  Node<int,_QHashDummyValue> *pNVar3;
  Bucket BVar4;
  
  uVar2 = (long)*key ^ this->seed;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  BVar4 = findBucketWithHash<int>(this,key,uVar2 >> 0x20 ^ uVar2);
  bVar1 = (BVar4.span)->offsets[BVar4.index];
  if (bVar1 == 0xff) {
    pNVar3 = (Node<int,_QHashDummyValue> *)0x0;
  }
  else {
    pNVar3 = (Node<int,_QHashDummyValue> *)((BVar4.span)->entries + bVar1);
  }
  return pNVar3;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }